

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs_helpers.cpp
# Opt level: O2

string * PermsToSymbolicString_abi_cxx11_(string *__return_storage_ptr__,perms p)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  (__return_storage_ptr__->field_2)._M_allocated_capacity = 0x2d2d2d2d2d2d2d2d;
  *(undefined2 *)((long)&__return_storage_ptr__->field_2 + 8) = 0x2d;
  __return_storage_ptr__->_M_string_length = 9;
  if ((p >> 8 & 1) != 0) {
    (__return_storage_ptr__->field_2)._M_local_buf[0] = 'r';
  }
  if ((char)p < '\0') {
    (__return_storage_ptr__->field_2)._M_local_buf[1] = 'w';
  }
  if ((p & owner_exec) != none) {
    (__return_storage_ptr__->field_2)._M_local_buf[2] = 'x';
  }
  if ((p & group_read) != none) {
    (__return_storage_ptr__->field_2)._M_local_buf[3] = 'r';
  }
  if ((p & group_write) != none) {
    (__return_storage_ptr__->field_2)._M_local_buf[4] = 'w';
  }
  if ((p & group_exec) != none) {
    (__return_storage_ptr__->field_2)._M_local_buf[5] = 'x';
  }
  if ((p & others_read) != none) {
    (__return_storage_ptr__->field_2)._M_local_buf[6] = 'r';
  }
  if ((p & others_write) != none) {
    (__return_storage_ptr__->field_2)._M_local_buf[7] = 'w';
  }
  if ((p & others_exec) != none) {
    (__return_storage_ptr__->field_2)._M_local_buf[8] = 'x';
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string PermsToSymbolicString(fs::perms p)
{
    std::string perm_str(9, '-');

    auto set_perm = [&](size_t pos, fs::perms required_perm, char letter) {
        if ((p & required_perm) != fs::perms::none) {
            perm_str[pos] = letter;
        }
    };

    set_perm(0, fs::perms::owner_read,   'r');
    set_perm(1, fs::perms::owner_write,  'w');
    set_perm(2, fs::perms::owner_exec,   'x');
    set_perm(3, fs::perms::group_read,   'r');
    set_perm(4, fs::perms::group_write,  'w');
    set_perm(5, fs::perms::group_exec,   'x');
    set_perm(6, fs::perms::others_read,  'r');
    set_perm(7, fs::perms::others_write, 'w');
    set_perm(8, fs::perms::others_exec,  'x');

    return perm_str;
}